

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_c1a11d::LevelTest::LevelTest(LevelTest *this)

{
  __tuple_element_t<1UL,_tuple<const_CodecFactory_*,_TestMode,_int>_> *p_Var1;
  __tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int>_> *p_Var2;
  undefined8 *in_RDI;
  CodecFactory *in_stack_ffffffffffffffa8;
  EncoderTest *in_stack_ffffffffffffffb0;
  __tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int>_> *p_Var3;
  
  libaom_test::CodecTestWith2Params<libaom_test::TestMode,_int>::CodecTestWith2Params
            ((CodecTestWith2Params<libaom_test::TestMode,_int> *)in_stack_ffffffffffffffb0);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>::
  GetParam();
  std::get<0ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int>
            ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int> *)0x8afaec);
  libaom_test::EncoderTest::EncoderTest(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__LevelTest_01f826f0;
  in_RDI[2] = &PTR__LevelTest_01f82738;
  in_RDI[3] = &PTR__LevelTest_01f82758;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>::
  GetParam();
  p_Var1 = std::get<1ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int> *)
                      0x8afb41);
  *(__tuple_element_t<1UL,_tuple<const_CodecFactory_*,_TestMode,_int>_> *)((long)in_RDI + 0x3f4) =
       *p_Var1;
  p_Var3 = (__tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_int>_> *)(in_RDI + 0x7f);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>::
  GetParam();
  p_Var2 = std::get<2ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int> *)
                      0x8afb73);
  *p_Var3 = *p_Var2;
  *(undefined4 *)((long)in_RDI + 0x3fc) = 0x1f;
  return;
}

Assistant:

LevelTest()
      : EncoderTest(GET_PARAM(0)), encoding_mode_(GET_PARAM(1)),
        cpu_used_(GET_PARAM(2)), target_level_(31) {}